

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool place_new_monster_group
                (chunk *c,loc_conflict grid,monster_race *race,_Bool sleep,
                monster_group_info group_info,wchar_t total,uint8_t origin)

{
  _Bool _Var1;
  loc_conflict *p;
  loc_conflict grid_00;
  wchar_t local_54;
  loc_conflict try;
  loc_conflict *loc_list;
  int local_38;
  wchar_t loc_num;
  wchar_t i;
  wchar_t n;
  wchar_t total_local;
  _Bool sleep_local;
  monster_race *race_local;
  chunk *c_local;
  monster_group_info group_info_local;
  loc_conflict grid_local;
  
  p = (loc_conflict *)mem_zalloc((ulong)z_info->monster_group_max << 3);
  if (race != (monster_race *)0x0) {
    local_54 = total;
    if ((int)(uint)z_info->monster_group_max < total) {
      local_54 = (wchar_t)z_info->monster_group_max;
    }
    loc_list._4_4_ = L'\x01';
    *p = grid;
    for (loc_num = L'\0'; loc_num < loc_list._4_4_ && loc_list._4_4_ < local_54;
        loc_num = loc_num + L'\x01') {
      for (local_38 = 0; local_38 < 8 && loc_list._4_4_ < local_54; local_38 = local_38 + 1) {
        grid_00 = (loc_conflict)loc_sum((loc)p[loc_num],ddgrid_ddd[local_38]);
        _Var1 = square_isempty(c,grid_00);
        if ((_Var1) &&
           (_Var1 = place_new_monster_one(c,grid_00,race,sleep,group_info,origin), _Var1)) {
          p[loc_list._4_4_] = grid_00;
          loc_list._4_4_ = loc_list._4_4_ + L'\x01';
        }
      }
    }
    mem_free(p);
    return true;
  }
  __assert_fail("race",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                ,0x4cd,
                "_Bool place_new_monster_group(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, int, uint8_t)"
               );
}

Assistant:

static bool place_new_monster_group(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep,
		struct monster_group_info group_info,
		int total, uint8_t origin)
{
	int n, i;

	int loc_num;

	/* Locations of the placed monsters */
	struct loc *loc_list = mem_zalloc(sizeof(struct loc) *
									  z_info->monster_group_max);

	/* Sanity and bounds check */
	assert(race);
	total = MIN(total, z_info->monster_group_max);

	/* Start on the monster */
	loc_num = 1;
	loc_list[0] = grid;

	/* Puddle monsters, breadth first, up to total */
	for (n = 0; (n < loc_num) && (loc_num < total); n++) {
		/* Check each direction, up to total */
		for (i = 0; (i < 8) && (loc_num < total); i++) {
			struct loc try = loc_sum(loc_list[n], ddgrid_ddd[i]);

			/* Walls and Monsters block flow */
			if (!square_isempty(c, try)) continue;

			/* Attempt to place another monster */
			if (place_new_monster_one(c, try, race, sleep, group_info, origin)){
				/* Add it to the "hack" set */
				loc_list[loc_num] = try;
				loc_num++;
			}
		}
	}

	/* Success */
	mem_free(loc_list);
	return (true);
}